

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_75(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  long lVar6;
  QPDFWriter local_6c0 [8];
  QPDFWriter w;
  iterator local_6b0;
  allocator<char> local_679;
  string local_678 [32];
  QPDFObjectHandle local_658;
  QPDFObjectHandle local_648;
  QPDFNumberTreeObjectHelper local_638 [8];
  QPDFNumberTreeObjectHelper erase4;
  iterator local_600;
  iterator local_5d0;
  iterator local_5a0;
  iterator local_570;
  allocator<char> local_539;
  string local_538 [32];
  QPDFObjectHandle local_518;
  QPDFObjectHandle local_508;
  QPDFNumberTreeObjectHelper local_4f8 [8];
  QPDFNumberTreeObjectHelper erase3;
  allocator<char> local_4b9;
  string local_4b8 [32];
  QPDFObjectHandle local_498;
  QPDFObjectHandle local_488;
  QPDFObjectHandle local_478;
  allocator<char> local_461;
  string local_460 [32];
  QPDFObjectHandle local_440;
  allocator<char> local_429;
  string local_428 [32];
  QPDFObjectHandle local_408;
  QPDFObjectHandle local_3f8;
  iterator local_3e8;
  QPDFObjectHandle local_3b8;
  QPDFObjectHandle local_3a8;
  allocator<char> local_391;
  string local_390 [32];
  undefined1 local_370 [8];
  QPDFObjectHandle l1;
  string local_358 [32];
  QPDFObjectHandle local_338;
  undefined1 local_328 [8];
  QPDFObjectHandle k1;
  undefined1 local_2e8 [8];
  iterator iter2;
  QPDFNumberTreeObjectHelper local_2a8 [8];
  QPDFNumberTreeObjectHelper erase2;
  allocator<char> local_269;
  string local_268 [32];
  QPDFObjectHandle local_248;
  undefined1 local_238 [8];
  QPDFObjectHandle erase2_oh;
  iterator local_1e0;
  allocator<char> local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  iterator iter1;
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  QPDFObjectHandle value;
  allocator<char> local_91;
  string local_90 [32];
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFNameTreeObjectHelper local_50 [8];
  QPDFNameTreeObjectHelper erase1;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"/Erase1",&local_91);
  QPDFObjectHandle::getKey((string *)&local_60);
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
            (local_50,(QPDFObjectHandle *)&local_60,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_60);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  QPDFObjectHandle::~QPDFObjectHandle(&local_70);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"1X",&local_d9);
  bVar1 = QPDFNameTreeObjectHelper::remove((string *)local_50,(QPDFObjectHandle *)local_d8);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!erase1.remove(\"1X\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0c,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"1C",&local_101);
  bVar1 = QPDFNameTreeObjectHelper::remove((string *)local_50,(QPDFObjectHandle *)local_100);
  if ((bVar1 & 1) == 0) {
    __assert_fail("erase1.remove(\"1C\", &value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0d,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &iter1.ivalue.second.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                          "c");
  if (!bVar2) {
    __assert_fail("value.getUTF8Value() == \"c\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0e,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::~string
            ((string *)
             &iter1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"1B",&local_191);
  QPDFNameTreeObjectHelper::find((string *)local_170,SUB81(local_50,0));
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  QPDFNameTreeObjectHelper::iterator::remove();
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar2 = std::operator==(pbVar4,"1D");
  if (!bVar2) {
    __assert_fail("iter1->first == \"1D\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa11,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::remove();
  QPDFNameTreeObjectHelper::end();
  bVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_170,&local_1e0);
  if ((bVar1 & 1) == 0) {
    __assert_fail("iter1 == erase1.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa13,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_1e0);
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_170);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar2 = std::operator==(pbVar4,"1A");
  if (!bVar2) {
    __assert_fail("iter1->first == \"1A\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa15,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::remove();
  QPDFNameTreeObjectHelper::end();
  bVar1 = QPDFNameTreeObjectHelper::iterator::operator==
                    ((iterator *)local_170,
                     (iterator *)
                     &erase2_oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("iter1 == erase1.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa17,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &erase2_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_268,"/Erase2",&local_269);
  QPDFObjectHandle::getKey((string *)local_238);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  QPDFObjectHandle::~QPDFObjectHandle(&local_248);
  this = &iter2.ivalue.second.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)local_238);
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
            (local_2a8,(QPDFObjectHandle *)this,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &iter2.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNumberTreeObjectHelper::find((longlong)local_2e8,SUB81(local_2a8,0));
  QPDFNumberTreeObjectHelper::iterator::remove();
  QPDFNumberTreeObjectHelper::end();
  bVar1 = QPDFNumberTreeObjectHelper::iterator::operator==
                    ((iterator *)local_2e8,
                     (iterator *)
                     &k1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("iter2 == erase2.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa1d,"void test_75(QPDF &, const char *)");
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &k1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFNumberTreeObjectHelper::iterator::operator--((iterator *)local_2e8);
  plVar5 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->((iterator *)local_2e8);
  if (*plVar5 != 0xf0) {
    __assert_fail("iter2->first == 240",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa1f,"void test_75(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"/Kids",
             (allocator<char> *)
             ((long)&l1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_338);
  QPDFObjectHandle::getArrayItem((int)local_328);
  QPDFObjectHandle::~QPDFObjectHandle(&local_338);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&l1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"/Limits",&local_391);
  QPDFObjectHandle::getKey((string *)local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  QPDFObjectHandle::getArrayItem((int)&local_3a8);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xe6) {
    __assert_fail("l1.getArrayItem(0).getIntValue() == 230",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa22,"void test_75(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_3a8);
  QPDFObjectHandle::getArrayItem((int)&local_3b8);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xf0) {
    __assert_fail("l1.getArrayItem(1).getIntValue() == 240",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa23,"void test_75(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_3b8);
  QPDFNumberTreeObjectHelper::find((longlong)&local_3e8,SUB81(local_2a8,0));
  QPDFNumberTreeObjectHelper::iterator::operator=((iterator *)local_2e8,&local_3e8);
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_3e8);
  QPDFNumberTreeObjectHelper::iterator::remove();
  plVar5 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->((iterator *)local_2e8);
  if (*plVar5 != 0xdc) {
    __assert_fail("iter2->first == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa26,"void test_75(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_428,"/Kids",&local_429);
  QPDFObjectHandle::getKey((string *)&local_408);
  QPDFObjectHandle::getArrayItem((int)&local_3f8);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_328,&local_3f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_408);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"/Limits",&local_461);
  QPDFObjectHandle::getKey((string *)&local_440);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_370,&local_440);
  QPDFObjectHandle::~QPDFObjectHandle(&local_440);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  QPDFObjectHandle::getArrayItem((int)&local_478);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xdc) {
    __assert_fail("l1.getArrayItem(0).getIntValue() == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa29,"void test_75(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_478);
  QPDFObjectHandle::getArrayItem((int)&local_488);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xdc) {
    __assert_fail("l1.getArrayItem(1).getIntValue() == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa2a,"void test_75(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"/Kids",&local_4b9);
  QPDFObjectHandle::getKey((string *)&local_498);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_328,&local_498);
  QPDFObjectHandle::~QPDFObjectHandle(&local_498);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  iVar3 = QPDFObjectHandle::getArrayNItems();
  if (iVar3 != 1) {
    __assert_fail("k1.getArrayNItems() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa2c,"void test_75(QPDF &, const char *)");
  }
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_538,"/Erase3",&local_539);
  QPDFObjectHandle::getKey((string *)&local_508);
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
            (local_4f8,(QPDFObjectHandle *)&local_508,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_508);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_539);
  QPDFObjectHandle::~QPDFObjectHandle(&local_518);
  QPDFNumberTreeObjectHelper::find((longlong)&local_570,SUB81(local_4f8,0));
  QPDFNumberTreeObjectHelper::iterator::operator=((iterator *)local_2e8,&local_570);
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_570);
  QPDFNumberTreeObjectHelper::iterator::remove();
  QPDFNumberTreeObjectHelper::end();
  bVar1 = QPDFNumberTreeObjectHelper::iterator::operator==((iterator *)local_2e8,&local_5a0);
  if ((bVar1 & 1) == 0) {
    __assert_fail("iter2 == erase3.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa31,"void test_75(QPDF &, const char *)");
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_5a0);
  QPDFNumberTreeObjectHelper::remove((longlong)local_4f8,(QPDFObjectHandle *)0x136);
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::end();
  bVar1 = QPDFNumberTreeObjectHelper::iterator::operator==(&local_5d0,&local_600);
  if ((bVar1 & 1) == 0) {
    __assert_fail("erase3.begin() == erase3.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa33,"void test_75(QPDF &, const char *)");
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_600);
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_5d0);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_678,"/Erase4",&local_679);
  QPDFObjectHandle::getKey((string *)&local_648);
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
            (local_638,(QPDFObjectHandle *)&local_648,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_648);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator(&local_679);
  QPDFObjectHandle::~QPDFObjectHandle(&local_658);
  QPDFNumberTreeObjectHelper::find((longlong)&local_6b0,SUB81(local_638,0));
  QPDFNumberTreeObjectHelper::iterator::operator=((iterator *)local_2e8,&local_6b0);
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_6b0);
  QPDFNumberTreeObjectHelper::iterator::remove();
  plVar5 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->((iterator *)local_2e8);
  if (*plVar5 == 0x1ae) {
    QPDFWriter::QPDFWriter(local_6c0,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(local_6c0,0));
    QPDFWriter::setQDFMode(SUB81(local_6c0,0));
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_6c0);
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(local_638);
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(local_4f8);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_370);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_328);
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)local_2e8);
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(local_2a8);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_238);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_170);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b8);
    QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_50);
    return;
  }
  __assert_fail("iter2->first == 430",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xa38,"void test_75(QPDF &, const char *)");
}

Assistant:

static void
test_75(QPDF& pdf, char const* arg2)
{
    // This test is crafted to work with erase-nntree.pdf
    auto erase1 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Erase1"), pdf);
    QPDFObjectHandle value;
    assert(!erase1.remove("1X"));
    assert(erase1.remove("1C", &value));
    assert(value.getUTF8Value() == "c");
    auto iter1 = erase1.find("1B");
    iter1.remove();
    assert(iter1->first == "1D");
    iter1.remove();
    assert(iter1 == erase1.end());
    --iter1;
    assert(iter1->first == "1A");
    iter1.remove();
    assert(iter1 == erase1.end());

    auto erase2_oh = pdf.getTrailer().getKey("/Erase2");
    auto erase2 = QPDFNumberTreeObjectHelper(erase2_oh, pdf);
    auto iter2 = erase2.find(250);
    iter2.remove();
    assert(iter2 == erase2.end());
    --iter2;
    assert(iter2->first == 240);
    auto k1 = erase2_oh.getKey("/Kids").getArrayItem(1);
    auto l1 = k1.getKey("/Limits");
    assert(l1.getArrayItem(0).getIntValue() == 230);
    assert(l1.getArrayItem(1).getIntValue() == 240);
    iter2 = erase2.find(210);
    iter2.remove();
    assert(iter2->first == 220);
    k1 = erase2_oh.getKey("/Kids").getArrayItem(0);
    l1 = k1.getKey("/Limits");
    assert(l1.getArrayItem(0).getIntValue() == 220);
    assert(l1.getArrayItem(1).getIntValue() == 220);
    k1 = k1.getKey("/Kids");
    assert(k1.getArrayNItems() == 1);

    auto erase3 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Erase3"), pdf);
    iter2 = erase3.find(320);
    iter2.remove();
    assert(iter2 == erase3.end());
    erase3.remove(310);
    assert(erase3.begin() == erase3.end());

    auto erase4 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Erase4"), pdf);
    iter2 = erase4.find(420);
    iter2.remove();
    assert(iter2->first == 430);

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}